

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_boundary_z5_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>
               (vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
                *matrix)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_07;
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  lazy_ostream *plVar5;
  undefined4 local_a6c;
  size_t local_a68;
  basic_cstring<const_char> local_a60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a50;
  basic_cstring<const_char> local_a28;
  basic_cstring<const_char> local_a18;
  basic_cstring<const_char> local_a08;
  basic_cstring<const_char> local_9f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_9c8;
  assertion_result local_9b0;
  basic_cstring<const_char> local_998;
  basic_cstring<const_char> local_988;
  uint local_978 [10];
  iterator local_950;
  undefined8 local_948;
  Field_element local_940;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_939;
  int local_938 [12];
  pair<unsigned_int,_unsigned_int> local_908;
  pair<unsigned_int,_unsigned_int> local_900;
  pair<unsigned_int,_unsigned_int> local_8f8;
  pair<unsigned_int,_unsigned_int> local_8f0;
  pair<unsigned_int,_unsigned_int> local_8e8;
  pair<unsigned_int,_unsigned_int> local_8e0;
  iterator local_8d8;
  size_type local_8d0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_8c8;
  undefined1 local_8b0 [8];
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  col4;
  size_t local_878;
  basic_cstring<const_char> local_870;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_860;
  basic_cstring<const_char> local_838;
  basic_cstring<const_char> local_828;
  basic_cstring<const_char> local_818;
  basic_cstring<const_char> local_808;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7d8;
  assertion_result local_7c0;
  basic_cstring<const_char> local_7a8;
  basic_cstring<const_char> local_798;
  uint local_788 [10];
  iterator local_760;
  undefined8 local_758;
  Field_element local_750;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_749;
  int local_748 [10];
  pair<unsigned_int,_unsigned_int> local_720;
  pair<unsigned_int,_unsigned_int> local_718;
  pair<unsigned_int,_unsigned_int> local_710;
  pair<unsigned_int,_unsigned_int> local_708;
  pair<unsigned_int,_unsigned_int> local_700;
  iterator local_6f8;
  size_type local_6f0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_6e8;
  undefined1 local_6d0 [8];
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  col3;
  size_t local_698;
  basic_cstring<const_char> local_690;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_680;
  basic_cstring<const_char> local_658;
  basic_cstring<const_char> local_648;
  basic_cstring<const_char> local_638;
  basic_cstring<const_char> local_628;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_618;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5f8;
  assertion_result local_5e0;
  basic_cstring<const_char> local_5c8;
  basic_cstring<const_char> local_5b8;
  uint local_5a8 [10];
  iterator local_580;
  undefined8 local_578;
  Field_element local_56c;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_568;
  undefined1 local_550 [8];
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  col2;
  size_t local_518;
  basic_cstring<const_char> local_510;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_500;
  basic_cstring<const_char> local_4d8;
  basic_cstring<const_char> local_4c8;
  basic_cstring<const_char> local_4b8;
  basic_cstring<const_char> local_4a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_498;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_478;
  assertion_result local_460;
  basic_cstring<const_char> local_448;
  basic_cstring<const_char> local_438;
  uint local_428 [8];
  iterator local_408;
  undefined8 local_400;
  Field_element local_3f8 [2];
  size_t local_3f0;
  basic_cstring<const_char> local_3e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3d8;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  basic_cstring<const_char> local_390;
  basic_cstring<const_char> local_380;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_370;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_350;
  assertion_result local_338;
  basic_cstring<const_char> local_320;
  basic_cstring<const_char> local_310;
  initializer_list<unsigned_int> local_300;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_2e9;
  int local_2e8 [10];
  pair<unsigned_int,_unsigned_int> local_2c0;
  pair<unsigned_int,_unsigned_int> local_2b8;
  pair<unsigned_int,_unsigned_int> local_2b0;
  pair<unsigned_int,_unsigned_int> local_2a8;
  pair<unsigned_int,_unsigned_int> local_2a0;
  iterator local_298;
  size_type local_290;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_288;
  undefined1 local_270 [8];
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  col1;
  size_t local_238;
  basic_cstring<const_char> local_230;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_220;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  assertion_result local_180;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  uint local_148 [10];
  iterator local_120;
  undefined8 local_118;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_109;
  int local_108 [10];
  pair<unsigned_int,_unsigned_int> local_e0;
  pair<unsigned_int,_unsigned_int> local_d8;
  pair<unsigned_int,_unsigned_int> local_d0;
  pair<unsigned_int,_unsigned_int> local_c8;
  pair<unsigned_int,_unsigned_int> local_c0;
  iterator local_b8;
  size_type local_b0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a8;
  undefined1 local_90 [8];
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  col0;
  undefined1 local_50 [8];
  Column_settings settings;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
  *matrix_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
  Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings((Column_zp_settings *)local_50,5);
  local_108[9] = 0;
  local_108[8] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_e0,local_108 + 9,local_108 + 8)
  ;
  local_108[7] = 1;
  local_108[6] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_d8,local_108 + 7,local_108 + 6)
  ;
  local_108[5] = 2;
  local_108[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_d0,local_108 + 5,local_108 + 4)
  ;
  local_108[3] = 5;
  local_108[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_c8,local_108 + 3,local_108 + 2)
  ;
  local_108[1] = 6;
  local_108[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_c0,local_108 + 1,local_108);
  local_b8 = &local_e0;
  local_b0 = 5;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_109);
  __l_07._M_len = local_b0;
  __l_07._M_array = local_b8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_a8,__l_07,&local_109);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)local_90,&local_a8,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_a8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_109);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::operator+=((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
                *)pvVar3,
               (List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                *)local_90);
  local_148[4] = 0;
  local_148[5] = 0;
  local_148[6] = 1;
  local_148[0] = 0;
  local_148[1] = 4;
  local_148[2] = 1;
  local_148[3] = 3;
  local_120 = local_148;
  local_118 = 7;
  __l_06._M_len = 7;
  __l_06._M_array = local_120;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_06);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_168);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_158,0x386,&local_168);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
    ::get_content(&local_198,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_198,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_180,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,"matrix[0].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_1b8,plVar5,&local_1c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_180,&local_1b8,&local_1d8,0x386,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1b8);
    boost::test_tools::assertion_result::~assertion_result(&local_180);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_198);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x388,&local_1f8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_220,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    local_238 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                ::size(pvVar3);
    col1.entryPool_._4_4_ = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_220,&local_230,0x388,1,2,&local_238,"matrix[0].size()",
               (undefined1 *)((long)&col1.entryPool_ + 4),"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_220);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_2e8[9] = 0;
  local_2e8[8] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2c0,local_2e8 + 9,local_2e8 + 8);
  local_2e8[7] = 1;
  local_2e8[6] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2b8,local_2e8 + 7,local_2e8 + 6);
  local_2e8[5] = 2;
  local_2e8[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2b0,local_2e8 + 5,local_2e8 + 4);
  local_2e8[3] = 5;
  local_2e8[2] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2a8,local_2e8 + 3,local_2e8 + 2);
  local_2e8[1] = 6;
  local_2e8[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_2a0,local_2e8 + 1,local_2e8);
  local_298 = &local_2c0;
  local_290 = 5;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_2e9);
  __l_05._M_len = local_290;
  __l_05._M_array = local_298;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_288,__l_05,&local_2e9);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)local_270,&local_288,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_288);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_2e9);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::operator+=((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
                *)pvVar3,
               (List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                *)local_270);
  std::initializer_list<unsigned_int>::initializer_list(&local_300);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,local_300);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_320);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_310,0x38f,&local_320);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
    ::get_content(&local_350,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_350,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_338,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,"matrix[1].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_370,plVar5,&local_380);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_338,&local_370,&local_390,0x38f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_370);
    boost::test_tools::assertion_result::~assertion_result(&local_338);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_350);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3a0,0x391,&local_3b0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3d8,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    local_3f0 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                ::size(pvVar3);
    local_3f8[1] = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_3d8,&local_3e8,0x391,1,2,&local_3f0,"matrix[1].size()",local_3f8 + 1,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,4);
  local_3f8[0] = 4;
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)pvVar3,local_3f8,
             (List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
              *)local_270);
  local_428[4] = 0;
  local_428[5] = 0;
  local_428[6] = 4;
  local_428[0] = 0;
  local_428[1] = 1;
  local_428[2] = 4;
  local_428[3] = 2;
  local_408 = local_428;
  local_400 = 7;
  __l_04._M_len = 7;
  __l_04._M_array = local_408;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_04);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_448);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_438,0x397,&local_448);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
    ::get_content(&local_478,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_478,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_460,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a8,"matrix[4].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_498,plVar5,&local_4a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_460,&local_498,&local_4b8,0x397,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_498);
    boost::test_tools::assertion_result::~assertion_result(&local_460);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_478);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4c8,0x399,&local_4d8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_500,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    local_518 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                ::size(pvVar3);
    col2.entryPool_._4_4_ = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_500,&local_510,0x399,1,2,&local_518,"matrix[4].size()",
               (undefined1 *)((long)&col2.entryPool_ + 4),"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_500);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_568.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_568);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)local_550,&local_568,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_568);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  local_56c = 3;
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  multiply_source_and_add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)pvVar3,
             (List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
              *)local_550,&local_56c);
  local_5a8[4] = 0;
  local_5a8[5] = 1;
  local_5a8[6] = 1;
  local_5a8[0] = 4;
  local_5a8[1] = 2;
  local_5a8[2] = 1;
  local_5a8[3] = 0;
  local_580 = local_5a8;
  local_578 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_580;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_03);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5b8,0x39f,&local_5c8);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
    ::get_content(&local_5f8,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_5f8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_5e0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_628,"matrix[5].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_618,plVar5,&local_628);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_638,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_5e0,&local_618,&local_638,0x39f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_618);
    boost::test_tools::assertion_result::~assertion_result(&local_5e0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_648,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_658);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_648,0x3a0,&local_658);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_680,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    local_698 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                ::size(pvVar3);
    col3.entryPool_._4_4_ = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_680,&local_690,0x3a0,1,2,&local_698,"matrix[5].size()",
               (undefined1 *)((long)&col3.entryPool_ + 4),"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_680);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_748[9] = 0;
  local_748[8] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_720,local_748 + 9,local_748 + 8);
  local_748[7] = 2;
  local_748[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_718,local_748 + 7,local_748 + 6);
  local_748[5] = 3;
  local_748[4] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_710,local_748 + 5,local_748 + 4);
  local_748[3] = 5;
  local_748[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_708,local_748 + 3,local_748 + 2);
  local_748[1] = 6;
  local_748[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_700,local_748 + 1,local_748);
  local_6f8 = &local_720;
  local_6f0 = 5;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_749);
  __l_02._M_len = local_6f0;
  __l_02._M_array = local_6f8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_6e8,__l_02,&local_749);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)local_6d0,&local_6e8,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_6e8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_749);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  local_750 = 3;
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  multiply_source_and_add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)pvVar3,
             (List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
              *)local_6d0,&local_750);
  local_788[4] = 0;
  local_788[5] = 2;
  local_788[6] = 4;
  local_788[0] = 3;
  local_788[1] = 2;
  local_788[2] = 4;
  local_788[3] = 1;
  local_760 = local_788;
  local_758 = 7;
  __l_01._M_len = 7;
  __l_01._M_array = local_760;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_01);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_798,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_798,0x3a5,&local_7a8);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
    ::get_content(&local_7d8,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_7d8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_7c0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_808,"matrix[5].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_7f8,plVar5,&local_808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_818,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_7c0,&local_7f8,&local_818,0x3a5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7f8);
    boost::test_tools::assertion_result::~assertion_result(&local_7c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_7d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_828,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_838);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_828,0x3a7,&local_838);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_860,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_870,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    local_878 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                ::size(pvVar3);
    col4.entryPool_._4_4_ = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_860,&local_870,0x3a7,1,2,&local_878,"matrix[5].size()",
               (undefined1 *)((long)&col4.entryPool_ + 4),"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_860);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_938[0xb] = 0;
  local_938[10] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_908,local_938 + 0xb,local_938 + 10);
  local_938[9] = 1;
  local_938[8] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_900,local_938 + 9,local_938 + 8);
  local_938[7] = 2;
  local_938[6] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8f8,local_938 + 7,local_938 + 6);
  local_938[5] = 3;
  local_938[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8f0,local_938 + 5,local_938 + 4);
  local_938[3] = 5;
  local_938[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8e8,local_938 + 3,local_938 + 2);
  local_938[1] = 6;
  local_938[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_8e0,local_938 + 1,local_938);
  local_8d8 = &local_908;
  local_8d0 = 6;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_939);
  __l_00._M_len = local_8d0;
  __l_00._M_array = local_8d8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_8c8,__l_00,&local_939);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)local_8b0,&local_8c8,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_8c8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_939);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,3);
  local_940 = 4;
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
              *)pvVar3,&local_940,
             (List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
              *)local_8b0);
  local_978[4] = 0;
  local_978[5] = 2;
  local_978[6] = 4;
  local_978[0] = 3;
  local_978[1] = 2;
  local_978[2] = 4;
  local_978[3] = 1;
  local_950 = local_978;
  local_948 = 7;
  __l._M_len = 7;
  __l._M_array = local_950;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_988,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_998);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_988,0x3ad,&local_998);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
    ::get_content(&local_9c8,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_9c8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_9b0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9f8,"matrix[3].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_9e8,plVar5,&local_9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_9b0,&local_9e8,&local_a08,0x3ad,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9e8);
    boost::test_tools::assertion_result::~assertion_result(&local_9b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_9c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a28);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a18,0x3af,&local_a28);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a50,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    local_a68 = Gudhi::persistence_matrix::
                List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                ::size(pvVar3);
    local_a6c = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_a50,&local_a60,0x3af,1,2,&local_a68,"matrix[3].size()",&local_a6c,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  ::~List_column((List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                  *)local_8b0);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  ::~List_column((List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                  *)local_6d0);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  ::~List_column((List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                  *)local_550);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  ::~List_column((List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                  *)local_270);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  ::~List_column((List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                  *)local_90);
  Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>
  ::Column_zp_settings::~Column_zp_settings((Column_zp_settings *)local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
  return;
}

Assistant:

void column_test_boundary_z5_operators(std::vector<Column>& matrix) {
  using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;

  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings(5);

  const Column col0(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &settings);
  matrix[0] += col0;

  veccont = {0, 4, 1, 3, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 4);
  }

  const Column col1(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, col1);
  veccont = {0, 1, 4, 2, 0, 0, 4};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 4);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  // this = this + column * v
  const Column col3(cont{{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 6);
  }
  // this = v * this + column
  const Column col4(cont{{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 6);
  }
}